

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::object_matcher<pstore::json::null_output>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,object_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  _Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
  _Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  byte *pbVar6;
  error_category *peVar7;
  ulong uVar8;
  int iVar9;
  matcher<pstore::json::null_output> *pmVar10;
  undefined8 uVar11;
  error_code err;
  error_code err_00;
  
  if ((this->super_matcher<pstore::json::null_output>).state_ == 1) {
    if ((parser->error_)._M_value == 0) {
      assert_failed("parser.last_error ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4f6);
    }
LAB_0017fa8c:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
         = 1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
    _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
LAB_0017fa9b:
    bVar5 = true;
  }
  else {
    if (ch->valid_ == false) {
      peVar7 = get_error_category();
      err._M_cat = peVar7;
      err._0_8_ = 7;
      bVar5 = parser<pstore::json::null_output>::set_error(parser,err);
      if (bVar5) {
        (this->super_matcher<pstore::json::null_output>).state_ = 1;
      }
      goto LAB_0017fa8c;
    }
    pbVar6 = (byte *)maybe<char,_void>::operator->(ch);
    iVar9 = (this->super_matcher<pstore::json::null_output>).state_;
    if (6 < iVar9 - 1U) goto LAB_0017fa8c;
    bVar1 = *pbVar6;
    uVar8 = (ulong)bVar1;
    switch(iVar9) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x536);
    case 2:
      if (bVar1 != 0x7b) {
        assert_failed("c == \'{\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x500);
      }
      (this->super_matcher<pstore::json::null_output>).state_ = 3;
      uVar8 = std::_V2::system_category();
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      bVar5 = parser<pstore::json::null_output>::set_error(parser,(error_code)(auVar3 << 0x40));
      iVar9 = 1;
      if (bVar5) {
LAB_0017fa88:
        (this->super_matcher<pstore::json::null_output>).state_ = iVar9;
        goto LAB_0017fa8c;
      }
LAB_0017fa46:
      _Var2._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var2._M_head_impl)->terminal + 8) = 2;
      ((_Var2._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bf5f8;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
      _M_head_impl = (matcher<pstore::json::null_output> *)&(_Var2._M_head_impl)->terminal;
      goto LAB_0017fa9b;
    case 3:
      if (bVar1 == 0x7d) {
LAB_0017fa71:
        uVar8 = std::_V2::system_category();
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar8;
        parser<pstore::json::null_output>::set_error(parser,(error_code)(auVar4 << 0x40));
        iVar9 = 1;
        goto LAB_0017fa88;
      }
    case 4:
      (this->super_matcher<pstore::json::null_output>).state_ = 5;
      _Var2._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
           ._M_head_impl;
      pmVar10 = (matcher<pstore::json::null_output> *)&(_Var2._M_head_impl)->root;
      *(undefined4 *)((long)&(_Var2._M_head_impl)->root + 8) = 2;
      ((_Var2._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bf638;
      *(undefined1 *)((long)&(_Var2._M_head_impl)->root + 0xc) = 1;
      break;
    case 5:
      if (0x3a < bVar1) {
LAB_0017f9a8:
        peVar7 = get_error_category();
        uVar11 = 3;
        goto LAB_0017fab6;
      }
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        iVar9 = 6;
        if (uVar8 == 0x3a) goto LAB_0017fa88;
        goto LAB_0017f9a8;
      }
LAB_0017fa05:
      _Var2._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
           ._M_head_impl;
      pmVar10 = (matcher<pstore::json::null_output> *)&(_Var2._M_head_impl)->terminal;
      *(undefined4 *)((long)&(_Var2._M_head_impl)->terminal + 8) = 2;
      ((_Var2._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bf5f8;
      break;
    case 6:
      (this->super_matcher<pstore::json::null_output>).state_ = 7;
      _Var2._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::json::null_output>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)&(_Var2._M_head_impl)->root + 8) = 2;
      ((_Var2._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bf638;
      bVar5 = false;
      *(undefined1 *)((long)&(_Var2._M_head_impl)->root + 0xc) = 0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
      _M_head_impl = (matcher<pstore::json::null_output> *)&(_Var2._M_head_impl)->root;
      goto LAB_0017fa9d;
    case 7:
      if (bVar1 < 0x2d) {
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0017fa05;
        if (uVar8 == 0x2c) {
          (this->super_matcher<pstore::json::null_output>).state_ =
               ((parser->extensions_ & object_trailing_comma) == none) + 3;
          goto LAB_0017fa46;
        }
      }
      if (bVar1 == 0x7d) goto LAB_0017fa71;
      peVar7 = get_error_category();
      uVar11 = 7;
LAB_0017fab6:
      err_00._M_cat = peVar7;
      err_00._0_8_ = uVar11;
      bVar5 = parser<pstore::json::null_output>::set_error(parser,err_00);
      iVar9 = 1;
      if (bVar5) goto LAB_0017fa88;
      goto LAB_0017fa8c;
    }
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
    _M_head_impl = pmVar10;
    bVar5 = false;
  }
LAB_0017fa9d:
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            object_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (this->get_state () == done_state) {
                    PSTORE_ASSERT (parser.last_error ());
                    return {nullptr, true};
                }
                if (!ch) {
                    this->set_error (parser, error_code::expected_object_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '{');
                    this->set_state (first_key_state);
                    if (this->set_error (parser, parser.callbacks ().begin_object ())) {
                        break;
                    }
                    return {this->make_whitespace_matcher (parser), true};
                case first_key_state:
                    // We allow either a closing brace (to end the object) or a property name.
                    if (c == '}') {
                        this->end_object (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case key_state:
                    // Match a property name then expect a colon.
                    this->set_state (colon_state);
                    return {this->make_root_matcher (parser, true /*object key?*/), false};
                case colon_state:
                    if (isspace (c)) {
                        // just consume whitespace before the colon.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ':') {
                        this->set_state (value_state);
                    } else {
                        this->set_error (parser, error_code::expected_colon);
                    }
                    break;
                case value_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before the comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ',') {
                        // Strictly conforming JSON requires a property name following a comma but
                        // we have an extension to allow an trailing comma which may be followed by
                        // the object's closing brace.
                        this->set_state (
                            (parser.extension_enabled (extensions::object_trailing_comma))
                                ? first_key_state
                                : key_state);
                        // Consume the comma and any whitespace before the close brace or property
                        // name.
                        return {this->make_whitespace_matcher (parser), true};
                    }
                    if (c == '}') {
                        this->end_object (parser);
                    } else {
                        this->set_error (parser, error_code::expected_object_member);
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                // No change of matcher. Consume the input character.
                return {nullptr, true};
            }